

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCase *testCase)

{
  byte _aborting;
  undefined1 uVar1;
  uint uVar2;
  string *_stdOut;
  string *_stdErr;
  Totals *this_00;
  TestCaseStats *this_01;
  TestCase *in_RDX;
  TestCaseStats *in_RSI;
  TestCaseInfo *in_RDI;
  TestCaseInfo testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string *in_stack_000004c0;
  string *in_stack_000004c8;
  RunContext *in_stack_000004d0;
  TrackerContext *in_stack_fffffffffffffc80;
  undefined5 in_stack_fffffffffffffc88;
  byte in_stack_fffffffffffffc8d;
  byte bVar3;
  byte local_362;
  TestCaseInfo *other;
  string *in_stack_fffffffffffffcc8;
  TrackerContext *in_stack_fffffffffffffcd0;
  undefined1 local_198 [272];
  string local_88 [32];
  string local_68 [32];
  undefined8 local_48;
  size_t sStack_40;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  size_t sStack_20;
  TestCase *local_10;
  
  local_48 = *(undefined8 *)&(in_RSI->testInfo).properties;
  sStack_40 = (in_RSI->totals).assertions.passed;
  local_38 = (in_RSI->totals).assertions.failed;
  sStack_30 = (in_RSI->totals).assertions.failedButOk;
  local_28 = (in_RSI->totals).testCases.passed;
  sStack_20 = (in_RSI->totals).testCases.failed;
  other = in_RDI;
  local_10 = in_RDX;
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  TestCase::getTestCaseInfo(local_10);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)in_RSI,other);
  _stdOut = (string *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)&(in_RSI->totals).testCases.failedButOk);
  (**(code **)((long)*(IShared *)_stdOut + 0x40))(_stdOut,local_198);
  *(TestCase **)&(in_RSI->testInfo).field_0x30 = local_10;
  do {
    TestCaseTracking::TrackerContext::startRun((TrackerContext *)in_RSI);
    do {
      TestCaseTracking::TrackerContext::startCycle(in_stack_fffffffffffffc80);
      _stdErr = (string *)
                TestCaseTracking::SectionTracker::acquire
                          (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      *(string **)&(in_RSI->testInfo).field_0x38 = _stdErr;
      runCurrentTest(in_stack_000004d0,in_stack_000004c8,in_stack_000004c0);
      _aborting = (**(code **)(**(long **)&(in_RSI->testInfo).field_0x38 + 0x30))();
      local_362 = 0;
      if ((_aborting & 1) == 0) {
        local_362 = (**(code **)(*(long *)&in_RSI->_vptr_TestCaseStats + 0x58))();
        local_362 = local_362 ^ 0xff;
      }
    } while ((local_362 & 1) != 0);
    this_00 = (Totals *)getCurrentContext();
    uVar2 = (*((_func_int **)(this_00->assertions).passed)[5])();
    uVar1 = (undefined1)uVar2;
    bVar3 = 0;
    if ((uVar2 & 1) != 0) {
      in_stack_fffffffffffffc8d = (**(code **)(*(long *)&in_RSI->_vptr_TestCaseStats + 0x58))();
      bVar3 = in_stack_fffffffffffffc8d ^ 0xff;
    }
  } while ((bVar3 & 1) != 0);
  Totals::delta(this_00,(Totals *)
                        CONCAT17(uVar1,CONCAT16(bVar3,CONCAT15(in_stack_fffffffffffffc8d,
                                                               in_stack_fffffffffffffc88))));
  Counts::operator+=((Counts *)&(in_RSI->totals).assertions.failedButOk,
                     (Counts *)&in_RDI->field_0x18);
  this_01 = (TestCaseStats *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)&(in_RSI->totals).testCases.failedButOk);
  (**(code **)(*(long *)&in_RSI->_vptr_TestCaseStats + 0x58))();
  TestCaseStats::TestCaseStats(in_RSI,other,(Totals *)in_RDI,_stdOut,_stdErr,(bool)_aborting);
  (*(((IShared *)&this_01->_vptr_TestCaseStats)->super_NonCopyable)._vptr_NonCopyable[0xd])
            (this_01,&stack0xfffffffffffffcc8);
  TestCaseStats::~TestCaseStats(this_01);
  *(undefined8 *)&(in_RSI->testInfo).field_0x30 = 0;
  *(undefined8 *)&(in_RSI->testInfo).field_0x38 = 0;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)this_01);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  return (Totals *)other;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                m_trackerContext.startRun();
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, testInfo.name );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }